

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<std::vector<(anonymous_namespace)::ns::Employee_NCGN,std::allocator<(anonymous_namespace)::ns::Employee_NCGN>>>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  type *in_RDI;
  vector<(anonymous_namespace)::ns::Employee_NCGN,_std::allocator<(anonymous_namespace)::ns::Employee_NCGN>_>
  *val;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_000000a8;
  
  json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<(anonymous_namespace)::ns::Employee_NCGN,std::allocator<(anonymous_namespace)::ns::Employee_NCGN>>,void>
  ::
  as<std::vector<(anonymous_namespace)::ns::Employee_NCGN,std::allocator<(anonymous_namespace)::ns::Employee_NCGN>>>
            (in_stack_000000a8);
  return in_RDI;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }